

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O1

void modifyChannels<unsigned_int>
               (list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                *channels,uint delta)

{
  int *piVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  long lVar5;
  _List_node_base *p_Var6;
  long lVar7;
  _List_node_base *p_Var8;
  
  for (p_Var2 = (channels->
                super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)channels;
      p_Var2 = (((_List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    p_Var3 = p_Var2[1]._M_next;
    if (0 < (long)p_Var3) {
      p_Var4 = p_Var2[1]._M_prev;
      lVar7 = 0;
      p_Var8 = (_List_node_base *)0x0;
      do {
        if (0 < (long)p_Var4) {
          lVar5 = *(long *)(p_Var2 + 1 + 1);
          p_Var6 = (_List_node_base *)0x0;
          do {
            piVar1 = (int *)(lVar5 + (long)p_Var6 * 4 + lVar7);
            *piVar1 = *piVar1 + delta;
            p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 1);
          } while (p_Var4 != p_Var6);
        }
        p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1);
        lVar7 = lVar7 + (long)p_Var4 * 4;
      } while (p_Var8 != p_Var3);
    }
  }
  return;
}

Assistant:

void
modifyChannels (list<Array2D<T>>& channels, T delta)
{
    //
    // Dummy code modifying each pixel by incrementing every channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                channel[y][x] += delta;
            }
        }
    }
}